

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  ImVector<ImFont::Glyph> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  stbtt__point sVar4;
  stbtt__point sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  stbtt_uint8 sVar8;
  byte bVar9;
  undefined2 uVar10;
  int iVar11;
  undefined4 uVar12;
  ImFontAtlas *pIVar13;
  stbtt_uint8 *data_00;
  stbtt__active_edge *psVar14;
  undefined8 *puVar15;
  stbrp_node *psVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [11];
  undefined1 auVar31 [13];
  undefined1 auVar32 [14];
  unkbyte10 Var33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  uint6 uVar39;
  undefined4 uVar40;
  stbtt_uint32 sVar41;
  stbtt_uint32 sVar42;
  stbtt_uint32 sVar43;
  stbtt_uint32 sVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  ImWchar *in_range;
  value_type *pvVar55;
  ImWchar *pIVar56;
  stbrp_context *context;
  stbrp_node *ptr;
  value_type *pvVar57;
  uchar *puVar58;
  uint *puVar59;
  ulong uVar60;
  void *pvVar61;
  stbtt__edge *p_00;
  stbtt__edge *psVar62;
  float *scanline;
  undefined8 *puVar63;
  long *plVar64;
  Glyph *pGVar65;
  value_type *pvVar66;
  ushort uVar67;
  uint uVar68;
  stbtt__active_edge *psVar69;
  stbtt__active_edge *psVar70;
  float *pfVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  float *pfVar75;
  long lVar76;
  float fVar77;
  ulong uVar78;
  size_t sz;
  long lVar79;
  stbtt_uint32 encoding_record;
  uint uVar80;
  int iVar81;
  uchar *puVar82;
  int i_1;
  int iVar83;
  long lVar84;
  stbtt__edge *psVar85;
  long lVar86;
  long lVar87;
  ulong uVar88;
  uchar *puVar89;
  ulong uVar90;
  ulong uVar91;
  byte *pbVar92;
  ImFont *pIVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  long lVar97;
  int char_idx;
  void *p;
  stbtt_fontinfo *psVar98;
  long lVar99;
  stbtt__active_edge *psVar100;
  byte *pbVar101;
  long lVar102;
  size_t sz_00;
  long lVar103;
  ulong uVar104;
  stbtt_uint8 *data;
  short *psVar105;
  bool bVar106;
  byte bVar107;
  char cVar113;
  char cVar114;
  float sum;
  float fVar108;
  float fVar109;
  float fVar110;
  char cVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  ushort uVar116;
  float fVar117;
  short sVar122;
  ushort uVar123;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar121 [16];
  ushort uVar126;
  ushort uVar128;
  undefined1 in_XMM2 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [12];
  float in_XMM3_Da;
  float fVar129;
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  stbtt__point *local_4a0;
  float y0_2;
  int local_46c;
  undefined8 local_468;
  int y0;
  float local_410;
  int ix0;
  undefined1 local_408 [12];
  float fStack_3fc;
  ImVector<ImFontConfig> *local_3f8;
  undefined8 *local_3f0;
  value_type *local_3e8;
  void *local_3e0;
  stbtt_fontinfo *local_3d8;
  long local_3d0;
  long local_3c8;
  ulong local_3c0;
  uchar *local_3b8;
  uint local_3ac;
  undefined1 local_3a8 [16];
  void *local_398;
  stbtt__edge *local_390;
  int x1;
  undefined4 uStack_384;
  stbtt_pack_context local_380;
  void *local_348;
  void *local_340;
  ulong local_338;
  ulong local_330;
  ulong local_328;
  uint local_320;
  uint local_31c;
  int local_318;
  int y0_1;
  int x0_1;
  int iy0;
  ImVector<stbrp_rect> extra_rects;
  int local_270;
  int x1_1;
  ulong local_268;
  undefined8 uStack_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  int x0;
  undefined4 uStack_234;
  int local_230;
  
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  this->TexID = (void *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  local_3f8 = &this->ConfigData;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  local_3e0 = ImGui::MemAlloc((long)(this->ConfigData).Size * 0x50);
  iVar83 = 0;
  iVar94 = 0;
  for (lVar102 = 0; iVar11 = local_3f8->Size, lVar102 < iVar11; lVar102 = lVar102 + 1) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_3f8,(int)lVar102);
    if ((pvVar55->DstFont == (ImFont *)0x0) ||
       (pIVar13 = pvVar55->DstFont->ContainerAtlas, pIVar13 != this && pIVar13 != (ImFontAtlas *)0x0
       )) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x4f9,"bool ImFontAtlas::Build()");
    }
    data_00 = (stbtt_uint8 *)pvVar55->FontData;
    iVar49 = pvVar55->FontNo;
    sVar8 = *data_00;
    if (sVar8 == '\0') {
      if (data_00[1] != '\x01') goto LAB_0013557d;
LAB_00132fa1:
      if ((data_00[2] != '\0') || (data_00[3] != '\0')) goto LAB_0013557d;
LAB_00132fe5:
      sVar48 = -(uint)(iVar49 != 0);
    }
    else {
      if (sVar8 != 't') {
        if (sVar8 != 'O') {
          if ((sVar8 != '1') || (data_00[1] != '\0')) goto LAB_0013557d;
          goto LAB_00132fa1;
        }
        if (((data_00[1] != 'T') || (data_00[2] != 'T')) || (data_00[3] != 'O')) goto LAB_0013557d;
        goto LAB_00132fe5;
      }
      if (data_00[1] != 't') {
        if (((data_00[1] != 'y') || (data_00[2] != 'p')) || (data_00[3] != '1')) goto LAB_0013557d;
        goto LAB_00132fe5;
      }
      if (((data_00[2] != 'c') || (data_00[3] != 'f')) ||
         (((sVar48 = ttULONG(data_00 + 4), sVar48 != 0x20000 && (sVar48 != 0x10000)) ||
          (uVar80 = *(uint *)(data_00 + 8),
          (int)(uVar80 >> 0x18 | (uVar80 & 0xff0000) >> 8 | (uVar80 & 0xff00) << 8 | uVar80 << 0x18)
          <= iVar49)))) goto LAB_0013557d;
      sVar48 = ttULONG(data_00 + (long)iVar49 * 4 + 0xc);
    }
    pvVar61 = local_3e0;
    if ((int)sVar48 < 0) {
LAB_0013557d:
      __assert_fail("font_offset >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x4fb,"bool ImFontAtlas::Build()");
    }
    *(stbtt_uint8 **)((long)local_3e0 + lVar102 * 0x50 + 8) = data_00;
    *(stbtt_uint32 *)((long)local_3e0 + lVar102 * 0x50 + 0x10) = sVar48;
    sVar41 = stbtt__find_table(data_00,sVar48,"cmap");
    sVar42 = stbtt__find_table(data_00,sVar48,"loca");
    *(stbtt_uint32 *)((long)pvVar61 + lVar102 * 0x50 + 0x18) = sVar42;
    sVar43 = stbtt__find_table(data_00,sVar48,"head");
    *(stbtt_uint32 *)((long)pvVar61 + lVar102 * 0x50 + 0x1c) = sVar43;
    sVar44 = stbtt__find_table(data_00,sVar48,"glyf");
    *(stbtt_uint32 *)((long)pvVar61 + lVar102 * 0x50 + 0x20) = sVar44;
    sVar45 = stbtt__find_table(data_00,sVar48,"hhea");
    *(stbtt_uint32 *)((long)pvVar61 + lVar102 * 0x50 + 0x24) = sVar45;
    sVar46 = stbtt__find_table(data_00,sVar48,"hmtx");
    *(stbtt_uint32 *)((long)pvVar61 + lVar102 * 0x50 + 0x28) = sVar46;
    sVar47 = stbtt__find_table(data_00,sVar48,"kern");
    *(stbtt_uint32 *)((long)pvVar61 + lVar102 * 0x50 + 0x2c) = sVar47;
    if (((((sVar41 == 0) || (sVar42 == 0)) || (sVar43 == 0)) || ((sVar44 == 0 || (sVar45 == 0)))) ||
       (sVar46 == 0)) goto LAB_0013547f;
    sVar48 = stbtt__find_table(data_00,sVar48,"maxp");
    if (sVar48 == 0) {
      uVar80 = 0xffff;
    }
    else {
      uVar80 = (uint)(ushort)(*(ushort *)(data_00 + (ulong)sVar48 + 4) << 8 |
                             *(ushort *)(data_00 + (ulong)sVar48 + 4) >> 8);
    }
    *(uint *)((long)pvVar61 + lVar102 * 0x50 + 0x14) = uVar80;
    uVar67 = *(ushort *)(data_00 + (ulong)sVar41 + 2);
    *(undefined4 *)((long)pvVar61 + lVar102 * 0x50 + 0x30) = 0;
    uVar78 = (ulong)(ushort)(uVar67 << 8 | uVar67 >> 8);
    uVar80 = sVar41 + 4;
    iVar49 = 0;
    while( true ) {
      bVar106 = uVar78 == 0;
      uVar78 = uVar78 - 1;
      if (bVar106) break;
      uVar67 = *(ushort *)(data_00 + uVar80) << 8 | *(ushort *)(data_00 + uVar80) >> 8;
      if ((uVar67 == 0) ||
         ((uVar67 == 3 &&
          ((uVar67 = *(ushort *)(data_00 + (ulong)uVar80 + 2) << 8 |
                     *(ushort *)(data_00 + (ulong)uVar80 + 2) >> 8, uVar67 == 10 || (uVar67 == 1))))
         )) {
        sVar48 = ttULONG(data_00 + (ulong)uVar80 + 4);
        iVar49 = sVar48 + sVar41;
        *(int *)((long)pvVar61 + lVar102 * 0x50 + 0x30) = iVar49;
      }
      uVar80 = uVar80 + 8;
    }
    if (iVar49 == 0) goto LAB_0013547f;
    *(uint *)((long)pvVar61 + lVar102 * 0x50 + 0x34) =
         (uint)(ushort)(*(ushort *)(data_00 + (long)(int)sVar43 + 0x32) << 8 |
                       *(ushort *)(data_00 + (long)(int)sVar43 + 0x32) >> 8);
    pIVar56 = pvVar55->GlyphRanges;
    if (pIVar56 == (ushort *)0x0) {
      pIVar56 = GetGlyphRangesDefault::ranges;
      pvVar55->GlyphRanges = GetGlyphRangesDefault::ranges;
    }
    for (; (*pIVar56 != 0 && (pIVar56[1] != 0)); pIVar56 = pIVar56 + 2) {
      iVar94 = (iVar94 - (uint)*pIVar56) + (uint)pIVar56[1] + 1;
      iVar83 = iVar83 + 1;
    }
  }
  uVar80 = this->TexDesiredWidth;
  if ((((int)uVar80 < 1) && (uVar80 = 0x1000, iVar94 < 0xfa1)) && (uVar80 = 0x800, iVar94 < 0x7d1))
  {
    uVar80 = (uint)(1000 < iVar94) * 0x200 + 0x200;
  }
  this->TexWidth = uVar80;
  this->TexHeight = 0;
  context = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar52 = uVar80 - 1;
  ptr = (stbrp_node *)ImGui::MemAlloc((ulong)uVar52 << 4);
  if ((context == (stbrp_context *)0x0) || (ptr == (stbrp_node *)0x0)) {
    if (context != (stbrp_context *)0x0) {
      ImGui::MemFree(context);
    }
    if (ptr != (stbrp_node *)0x0) {
      ImGui::MemFree(ptr);
    }
  }
  else {
    local_380.user_allocator_context = (void *)0x0;
    local_380.height = 0x8000;
    local_380.pixels = (uchar *)0x0;
    local_380.padding = 1;
    local_380.h_oversample = 1;
    local_380.v_oversample = 1;
    local_380.pack_info = context;
    local_380.width = uVar80;
    local_380.stride_in_bytes = uVar80;
    local_380.nodes = ptr;
    if (0x10000 < uVar80) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_rect_pack.h"
                    ,0xf2,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar80 = uVar80 - 2;
    uVar74 = 0;
    psVar16 = ptr;
    uVar78 = uVar74;
    if (0 < (int)uVar80) {
      uVar74 = (ulong)uVar80;
      uVar78 = uVar74;
    }
    while( true ) {
      bVar106 = uVar74 == 0;
      uVar74 = uVar74 - 1;
      if (bVar106) break;
      psVar16->next = psVar16 + 1;
      psVar16 = psVar16 + 1;
    }
    ptr[uVar78].next = (stbrp_node *)0x0;
    context->init_mode = 1;
    context->heuristic = 0;
    context->free_head = ptr;
    context->active_head = context->extra;
    context->width = uVar52;
    context->height = 0x7fff;
    context->num_nodes = uVar52;
    context->align = (int)(uVar80 + uVar52) / (int)uVar52;
    context->extra[0].x = 0;
    context->extra[0].y = 0;
    context->extra[0].next = context->extra + 1;
    context->extra[1].x = (stbrp_coord)uVar52;
    context->extra[1].y = 0xffff;
    context->extra[1].next = (stbrp_node *)0x0;
  }
  extra_rects.Size = 0;
  extra_rects.Capacity = 0;
  extra_rects.Data = (stbrp_rect *)0x0;
  RenderCustomTexData(this,0,&extra_rects);
  local_380.h_oversample = 1;
  local_380.v_oversample = 1;
  pvVar57 = ImVector<stbrp_rect>::operator[](&extra_rects,0);
  stbrp_pack_rects(context,pvVar57,extra_rects.Size);
  for (iVar49 = 0; iVar49 < extra_rects.Size; iVar49 = iVar49 + 1) {
    pvVar57 = ImVector<stbrp_rect>::operator[](&extra_rects,iVar49);
    if (pvVar57->was_packed != 0) {
      iVar81 = this->TexHeight;
      pvVar57 = ImVector<stbrp_rect>::operator[](&extra_rects,iVar49);
      uVar67 = pvVar57->y;
      pvVar57 = ImVector<stbrp_rect>::operator[](&extra_rects,iVar49);
      iVar50 = (uint)pvVar57->h + (uint)uVar67;
      if (iVar50 < iVar81) {
        iVar50 = iVar81;
      }
      this->TexHeight = iVar50;
    }
  }
  sz_00 = (long)iVar94 * 0x1c;
  local_398 = ImGui::MemAlloc(sz_00);
  sz = (long)iVar94 << 4;
  local_340 = ImGui::MemAlloc(sz);
  local_348 = ImGui::MemAlloc((long)iVar83 * 0x28);
  memset(local_398,0,sz_00);
  memset(local_340,0,sz);
  memset(local_348,0,(long)iVar83 * 0x28);
  uVar78 = 0;
  iVar49 = 0;
  iVar81 = 0;
  lVar103 = 0;
  while (lVar103 < local_3f8->Size) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_3f8,(int)lVar103);
    psVar98 = (stbtt_fontinfo *)(lVar103 * 0x50 + (long)local_3e0);
    pIVar56 = pvVar55->GlyphRanges;
    lVar97 = 0;
    local_3f0 = (undefined8 *)0x0;
    while ((pIVar56[lVar97 * 2] != 0 && (pIVar56[lVar97 * 2 + 1] != 0))) {
      local_3f0 = (undefined8 *)
                  (ulong)(((int)local_3f0 - (uint)pIVar56[lVar97 * 2]) +
                          (uint)pIVar56[lVar97 * 2 + 1] + 1);
      lVar97 = lVar97 + 1;
    }
    local_3c0 = uVar78 & 0xffffffff;
    pfVar75 = (float *)(local_3c0 * 0x28 + (long)local_348);
    psVar98[1].data = (uchar *)pfVar75;
    psVar98[1].fontstart = (int)lVar97;
    fVar108 = pvVar55->SizePixels;
    for (lVar84 = 0; lVar97 != lVar84; lVar84 = lVar84 + 1) {
      *pfVar75 = fVar108;
      uVar67 = pIVar56[lVar84 * 2];
      pfVar75[1] = (float)(uint)uVar67;
      iVar50 = (uint)pIVar56[lVar84 * 2 + 1] - (uint)uVar67;
      pfVar75[4] = (float)(iVar50 + 1);
      *(void **)(pfVar75 + 6) = (void *)((long)iVar81 * 0x1c + (long)local_398);
      iVar81 = iVar50 + iVar81 + 1;
      pfVar75 = pfVar75 + 10;
    }
    psVar98[1].userdata = (void *)((long)iVar49 * 0x10 + (long)local_340);
    local_3c8 = lVar103;
    stbtt_PackSetOversampling(&local_380,pvVar55->OversampleH,pvVar55->OversampleV);
    pvVar61 = psVar98[1].userdata;
    uVar74 = 0;
    uVar78 = (ulong)(uint)psVar98[1].fontstart;
    if (psVar98[1].fontstart < 1) {
      uVar78 = uVar74;
    }
    uVar60 = local_380._32_8_ & 0xffffffff;
    local_3e8 = (value_type *)CONCAT44(local_3e8._4_4_,(float)uVar60);
    local_3b8 = (uchar *)((ulong)local_380._32_8_ >> 0x20);
    fVar108 = (float)(long)local_3b8;
    sVar17 = (short)local_380.v_oversample;
    sVar18 = (short)local_380.padding;
    uVar104 = 0;
    local_3a8._0_8_ = psVar98[1].data;
    puVar58 = psVar98[1].data;
    while (iVar50 = (int)uVar104, uVar74 != uVar78) {
      local_408._0_8_ = uVar74;
      lVar103 = uVar74 * 0x28;
      fVar109 = *(float *)(puVar58 + lVar103);
      if (fVar109 <= 0.0) {
        fVar109 = -fVar109 /
                  (float)(ushort)(*(ushort *)(psVar98->data + (long)psVar98->head + 0x12) << 8 |
                                 *(ushort *)(psVar98->data + (long)psVar98->head + 0x12) >> 8);
      }
      else {
        fVar109 = stbtt_ScaleForPixelHeight(psVar98,fVar109);
      }
      puVar58[lVar103 + 0x20] = (uchar)uVar60;
      puVar58[lVar103 + 0x21] = (uchar)local_3b8;
      fVar117 = fVar109 * local_3e8._0_4_;
      psVar105 = (short *)((long)pvVar61 + (long)iVar50 * 0x10 + 6);
      for (lVar84 = 0; lVar84 < *(int *)(puVar58 + lVar103 + 0x10); lVar84 = lVar84 + 1) {
        if (*(long *)(puVar58 + lVar103 + 8) == 0) {
          iVar51 = *(int *)(puVar58 + lVar103 + 4) + (int)lVar84;
        }
        else {
          iVar51 = *(int *)(*(long *)(puVar58 + lVar103 + 8) + lVar84 * 4);
        }
        iVar51 = stbtt_FindGlyphIndex(psVar98,iVar51);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (psVar98,iVar51,fVar117,fVar109 * fVar108,in_XMM2._0_4_,in_XMM3_Da,&x0,&y0,&x1,
                   &ix0);
        psVar105[-1] = (((short)x1 + (short)uVar60) - (short)_x0) + sVar18 + -1;
        *psVar105 = ~(ushort)_y0 + (short)ix0 + sVar17 + sVar18;
        psVar105 = psVar105 + 8;
      }
      uVar104 = (ulong)(uint)(iVar50 + (int)lVar84);
      puVar58 = (uchar *)local_3a8._0_8_;
      uVar74 = local_408._0_8_ + 1;
    }
    stbrp_pack_rects((stbrp_context *)local_380.pack_info,(stbrp_rect *)psVar98[1].userdata,iVar50);
    uVar78 = local_3c0 + lVar97;
    iVar49 = (int)local_3f0 + iVar49;
    iVar51 = this->TexHeight;
    if (iVar50 < 1) {
      uVar104 = 0;
    }
    for (lVar103 = 0; uVar104 * 0x10 != lVar103; lVar103 = lVar103 + 0x10) {
      pvVar61 = psVar98[1].userdata;
      if (*(int *)((long)pvVar61 + lVar103 + 0xc) != 0) {
        iVar50 = (uint)*(ushort *)((long)pvVar61 + lVar103 + 6) +
                 (uint)*(ushort *)((long)pvVar61 + lVar103 + 10);
        if (iVar51 <= iVar50) {
          iVar51 = iVar50;
        }
        this->TexHeight = iVar51;
      }
    }
    lVar103 = local_3c8 + 1;
  }
  if (iVar49 != iVar94) {
    __assert_fail("buf_rects_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x54b,"bool ImFontAtlas::Build()");
  }
  if (iVar81 != iVar94) {
    __assert_fail("buf_packedchars_n == total_glyph_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x54c,"bool ImFontAtlas::Build()");
  }
  if ((int)uVar78 != iVar83) {
    __assert_fail("buf_ranges_n == total_glyph_range_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x54d,"bool ImFontAtlas::Build()");
  }
  uVar80 = this->TexHeight - 1;
  uVar80 = (int)uVar80 >> 1 | uVar80;
  uVar80 = (int)uVar80 >> 2 | uVar80;
  uVar80 = (int)uVar80 >> 4 | uVar80;
  uVar80 = (int)uVar80 >> 8 | uVar80;
  lVar103 = (long)(int)((int)uVar80 >> 0x10 | uVar80) + 1;
  this->TexHeight = (int)lVar103;
  puVar58 = (uchar *)ImGui::MemAlloc(this->TexWidth * lVar103);
  this->TexPixelsAlpha8 = puVar58;
  memset(puVar58,0,(long)this->TexHeight * (long)this->TexWidth);
  local_380.pixels = this->TexPixelsAlpha8;
  local_380.height = this->TexHeight;
  for (lVar103 = 0; lVar103 < local_3f8->Size; lVar103 = lVar103 + 1) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_3f8,(int)lVar103);
    pvVar61 = local_3e0;
    lVar79 = lVar103 * 0x50;
    local_3d8 = (stbtt_fontinfo *)((long)local_3e0 + lVar79);
    stbtt_PackSetOversampling(&local_380,pvVar55->OversampleH,pvVar55->OversampleV);
    lVar97 = *(long *)((long)pvVar61 + lVar79 + 0x38);
    lVar84 = *(long *)((long)pvVar61 + lVar79 + 0x40);
    uVar80 = *(uint *)((long)pvVar61 + lVar79 + 0x48);
    local_268._0_4_ = local_380.h_oversample;
    local_268._4_4_ = local_380.v_oversample;
    uStack_260 = 0;
    if ((int)uVar80 < 1) {
      uVar80 = 0;
    }
    lVar79 = 0;
    for (uVar78 = 0; uVar78 != uVar80; uVar78 = uVar78 + 1) {
      fVar108 = *(float *)(lVar84 + uVar78 * 0x28);
      if (fVar108 <= 0.0) {
        fVar108 = -fVar108 /
                  (float)(ushort)(*(ushort *)(local_3d8->data + (long)local_3d8->head + 0x12) << 8 |
                                 *(ushort *)(local_3d8->data + (long)local_3d8->head + 0x12) >> 8);
      }
      else {
        fVar108 = stbtt_ScaleForPixelHeight(local_3d8,fVar108);
      }
      lVar76 = uVar78 * 0x28 + lVar84;
      uVar74 = *(ulong *)(lVar76 + 0x20);
      auVar19._8_6_ = 0;
      auVar19._0_8_ = uVar74;
      auVar19[0xe] = (char)(uVar74 >> 0x38);
      auVar21._8_4_ = 0;
      auVar21._0_8_ = uVar74;
      auVar21[0xc] = (char)(uVar74 >> 0x30);
      auVar21._13_2_ = auVar19._13_2_;
      auVar22._8_4_ = 0;
      auVar22._0_8_ = uVar74;
      auVar22._12_3_ = auVar21._12_3_;
      auVar23._8_2_ = 0;
      auVar23._0_8_ = uVar74;
      auVar23[10] = (char)(uVar74 >> 0x28);
      auVar23._11_4_ = auVar22._11_4_;
      auVar24._8_2_ = 0;
      auVar24._0_8_ = uVar74;
      auVar24._10_5_ = auVar23._10_5_;
      auVar26[8] = (char)(uVar74 >> 0x20);
      auVar26._0_8_ = uVar74;
      auVar26._9_6_ = auVar24._9_6_;
      auVar28._7_8_ = 0;
      auVar28._0_7_ = auVar26._8_7_;
      cVar115 = (char)(uVar74 >> 0x18);
      Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),cVar115);
      auVar35._9_6_ = 0;
      auVar35._0_9_ = Var29;
      cVar114 = (char)(uVar74 >> 0x10);
      auVar30._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar30[0] = cVar114;
      auVar36._11_4_ = 0;
      auVar36._0_11_ = auVar30;
      cVar113 = (char)(uVar74 >> 8);
      auVar31._1_12_ = SUB1512(auVar36 << 0x20,3);
      auVar31[0] = cVar113;
      bVar107 = (byte)uVar74;
      uVar67 = CONCAT11(0,bVar107);
      auVar27._2_13_ = auVar31;
      auVar27._0_2_ = uVar67;
      uVar60 = (ulong)uVar67;
      sVar122 = 1 - auVar31._0_2_;
      sVar17 = -auVar30._0_2_;
      uVar116 = (ushort)Var29;
      sVar18 = -uVar116;
      auVar20._10_2_ = 0;
      auVar20._0_10_ = auVar27._0_10_;
      auVar20._12_2_ = uVar116;
      uVar39 = CONCAT42(auVar20._10_4_,auVar30._0_2_);
      auVar32._6_8_ = 0;
      auVar32._0_6_ = uVar39;
      Var33 = CONCAT82(SUB148(auVar32 << 0x40,6),auVar31._0_2_);
      auVar25._4_10_ = Var33;
      auVar25._0_4_ = CONCAT22(0,uVar67);
      local_380._32_8_ = auVar25._0_8_;
      auVar124._0_4_ = (float)CONCAT22(0,uVar67);
      uVar52 = (uint)Var33;
      auVar124._4_4_ = (float)uVar52;
      auVar124._8_4_ = (float)(int)uVar39;
      auVar124._12_4_ = (float)uVar116;
      local_258 = divps(_DAT_00155110,auVar124);
      auVar130[0] = -(bVar107 == 0);
      auVar130[1] = -(bVar107 == 0);
      auVar130[2] = -(bVar107 == 0);
      auVar130[3] = -(bVar107 == 0);
      auVar130[4] = -(cVar113 == '\0');
      auVar130[5] = -(cVar113 == '\0');
      auVar130[6] = -(cVar113 == '\0');
      auVar130[7] = -(cVar113 == '\0');
      auVar130[8] = -(cVar114 == '\0');
      auVar130[9] = -(cVar114 == '\0');
      auVar130[10] = -(cVar114 == '\0');
      auVar130[0xb] = -(cVar114 == '\0');
      auVar130[0xc] = -(cVar115 == '\0');
      auVar130[0xd] = -(cVar115 == '\0');
      auVar130[0xe] = -(cVar115 == '\0');
      auVar130[0xf] = -(cVar115 == '\0');
      Var33 = CONCAT64(CONCAT42(CONCAT22(sVar18,sVar18),sVar17),CONCAT22(sVar17,sVar18));
      auVar127._4_8_ = (long)((unkuint10)Var33 >> 0x10);
      auVar127._2_2_ = sVar122;
      auVar127._0_2_ = sVar122;
      auVar111._0_4_ = (float)(int)(short)(1 - uVar67);
      auVar111._4_4_ = (float)(auVar127._0_4_ >> 0x10);
      auVar111._8_4_ = (float)((int)((unkuint10)Var33 >> 0x10) >> 0x10);
      auVar111._12_4_ = (float)(int)sVar18;
      in_XMM2._0_4_ = auVar124._0_4_ + auVar124._0_4_;
      in_XMM2._4_4_ = auVar124._4_4_ + auVar124._4_4_;
      in_XMM2._8_4_ = auVar124._8_4_ + auVar124._8_4_;
      in_XMM2._12_4_ = auVar124._12_4_ + auVar124._12_4_;
      local_248 = divps(auVar111,in_XMM2);
      local_248 = ~auVar130 & local_248;
      lVar79 = (long)(int)lVar79;
      uVar74 = (ulong)uVar52;
      lVar73 = 0;
LAB_00133a80:
      psVar98 = local_3d8;
      fVar109 = 0.0;
      if (lVar73 < *(int *)(lVar76 + 0x10)) {
        if (*(int *)(lVar97 + 0xc + lVar79 * 0x10) != 0) {
          if (*(long *)(lVar76 + 8) == 0) {
            iVar83 = *(int *)(lVar76 + 4) + (int)lVar73;
          }
          else {
            iVar83 = *(int *)(*(long *)(lVar76 + 8) + lVar73 * 4);
          }
          lVar99 = lVar79 * 0x10 + lVar97;
          puVar59 = (uint *)(lVar73 * 0x1c + *(long *)(lVar76 + 0x18));
          iVar94 = stbtt_FindGlyphIndex(local_3d8,iVar83);
          uVar3 = *(undefined8 *)(lVar99 + 4);
          auVar111 = pshuflw(ZEXT416((uint)local_380.padding),ZEXT416((uint)local_380.padding),0);
          uVar116 = (short)uVar3 - auVar111._0_2_;
          uVar123 = (short)((ulong)uVar3 >> 0x10) - auVar111._2_2_;
          uVar126 = (short)((ulong)uVar3 >> 0x20) + auVar111._4_2_;
          uVar128 = (short)((ulong)uVar3 >> 0x30) + auVar111._6_2_;
          *(ulong *)(lVar99 + 4) = CONCAT44(CONCAT22(uVar128,uVar126),CONCAT22(uVar123,uVar116));
          puVar58 = psVar98->data;
          uVar67 = *(ushort *)(puVar58 + (long)psVar98->hhea + 0x22) << 8 |
                   *(ushort *)(puVar58 + (long)psVar98->hhea + 0x22) >> 8;
          iVar83 = psVar98->hmtx;
          lVar86 = (ulong)uVar67 * 4 + (long)iVar83 + -4;
          lVar87 = (ulong)uVar67 * 4 + (long)iVar83 + -3;
          if (iVar94 < (int)(uint)uVar67) {
            lVar86 = (long)(iVar94 * 4) + (long)iVar83;
            lVar87 = (long)(iVar94 * 4) + 1 + (long)iVar83;
          }
          local_31c = (uint)puVar58[lVar86];
          local_320 = (uint)puVar58[lVar87];
          fVar110 = (float)uVar60 * fVar108;
          fVar118 = (float)uVar74 * fVar108;
          fVar117 = fVar108;
          stbtt_GetGlyphBitmapBoxSubpixel
                    (psVar98,iVar94,fVar110,fVar118,fVar108,fVar109,&x0_1,&y0_1,&x1_1,&local_270);
          puVar58 = local_380.pixels;
          local_3ac = local_380.stride_in_bytes;
          uVar52 = stbtt_GetGlyphShape(psVar98,iVar94,(stbtt_vertex **)&x1);
          auVar111 = _local_408;
          local_408._0_4_ = (uint)uVar116 - (int)uVar60;
          local_408._4_4_ = 0;
          stack0xfffffffffffffc00 = auVar111._8_8_;
          fVar77 = (float)(local_408._0_4_ + 1);
          stbtt_GetGlyphBitmapBoxSubpixel
                    (local_3d8,iVar94,fVar110,fVar118,fVar117,fVar109,&ix0,&iy0,(int *)0x0,
                     (int *)0x0);
          iVar83 = ix0;
          local_410 = fVar77;
          local_3d0 = lVar99;
          if ((fVar77 != 0.0) &&
             (uVar53 = ((uint)uVar123 - (int)uVar74) + 1, local_338 = (ulong)uVar53, uVar53 != 0)) {
            iVar94 = uVar128 * local_3ac;
            lVar86 = CONCAT44(uStack_384,x1);
            local_330 = (ulong)(uint)iy0;
            uVar60 = 0;
            uVar74 = (ulong)uVar52;
            if ((int)uVar52 < 1) {
              uVar74 = uVar60;
            }
            uVar104 = 0;
            for (; uVar74 * 10 - uVar60 != 0; uVar60 = uVar60 + 10) {
              uVar104 = (ulong)((int)uVar104 + (uint)(*(char *)(lVar86 + 8 + uVar60) == '\x01'));
            }
            if (((int)uVar104 != 0) &&
               (pvVar61 = ImGui::MemAlloc(uVar104 * 4), pvVar61 != (void *)0x0)) {
              fVar109 = fVar118;
              if (fVar110 <= fVar118) {
                fVar109 = fVar110;
              }
              local_4a0 = (stbtt__point *)0x0;
              iVar49 = 0;
              iVar50 = 0;
              iVar81 = 0;
              do {
                lVar99 = local_3d0;
                if (iVar50 == 1) {
                  local_4a0 = (stbtt__point *)ImGui::MemAlloc((long)iVar81 << 3);
                  if (local_4a0 == (stbtt__point *)0x0) {
                    ImGui::MemFree((void *)0x0);
                    lVar99 = local_3d0;
                    ImGui::MemFree(pvVar61);
                    break;
                  }
                }
                else if (iVar50 == 2) goto LAB_00133ec0;
                _x0 = _x0 & 0xffffffff00000000;
                fVar117 = 0.0;
                fVar77 = 0.0;
                uVar52 = 0xffffffff;
                for (lVar87 = 0; iVar81 = x0, uVar74 * 10 - lVar87 != 0; lVar87 = lVar87 + 10) {
                  cVar113 = *(char *)(lVar86 + 8 + lVar87);
                  if (cVar113 == '\x03') {
                    stbtt__tesselate_curve
                              (local_4a0,&x0,fVar117,fVar77,
                               (float)(int)*(short *)(lVar86 + 4 + lVar87),
                               (float)(int)*(short *)(lVar86 + 6 + lVar87),
                               (float)(int)*(short *)(lVar86 + lVar87),
                               (float)(int)*(short *)(lVar86 + 2 + lVar87),
                               (0.35 / fVar109) * (0.35 / fVar109),0);
                    auVar111 = pshuflw(ZEXT416(*(uint *)(lVar86 + lVar87)),
                                       ZEXT416(*(uint *)(lVar86 + lVar87)),0x60);
                    fVar117 = (float)(auVar111._0_4_ >> 0x10);
                    fVar77 = (float)(auVar111._4_4_ >> 0x10);
                  }
                  else if (cVar113 == '\x02') {
                    lVar99 = (long)x0;
                    auVar111 = pshuflw(ZEXT416(*(uint *)(lVar86 + lVar87)),
                                       ZEXT416(*(uint *)(lVar86 + lVar87)),0x60);
                    fVar117 = (float)(auVar111._0_4_ >> 0x10);
                    fVar77 = (float)(auVar111._4_4_ >> 0x10);
                    _x0 = CONCAT44(uStack_234,x0 + 1);
                    if (local_4a0 != (stbtt__point *)0x0) {
                      local_4a0[lVar99].x = fVar117;
                      local_4a0[lVar99].y = fVar77;
                    }
                  }
                  else if (cVar113 == '\x01') {
                    if (-1 < (int)uVar52) {
                      *(int *)((long)pvVar61 + (ulong)uVar52 * 4) = x0 - iVar49;
                    }
                    uVar52 = uVar52 + 1;
                    auVar111 = pshuflw(ZEXT416(*(uint *)(lVar86 + lVar87)),
                                       ZEXT416(*(uint *)(lVar86 + lVar87)),0x60);
                    fVar117 = (float)(auVar111._0_4_ >> 0x10);
                    fVar77 = (float)(auVar111._4_4_ >> 0x10);
                    _x0 = CONCAT44(uStack_234,x0 + 1);
                    iVar49 = iVar81;
                    if (local_4a0 != (stbtt__point *)0x0) {
                      local_4a0[iVar81].x = fVar117;
                      local_4a0[iVar81].y = fVar77;
                    }
                  }
                }
                *(int *)((long)pvVar61 + (long)(int)uVar52 * 4) = x0 - iVar49;
                iVar50 = iVar50 + 1;
              } while( true );
            }
          }
          goto LAB_00134a95;
        }
        goto LAB_00135006;
      }
    }
    local_380._32_8_ = local_268;
    local_3d8[1].userdata = (void *)0x0;
  }
  ImGui::MemFree(local_380.nodes);
  ImGui::MemFree(local_380.pack_info);
  ImGui::MemFree(local_340);
  uVar78 = 0;
  while (auVar127 = in_XMM2._4_12_, (long)uVar78 < (long)local_3f8->Size) {
    pvVar55 = ImVector<ImFontConfig>::operator[](local_3f8,(int)uVar78);
    pvVar61 = local_3e0;
    lVar97 = uVar78 * 0x50;
    psVar98 = (stbtt_fontinfo *)((long)local_3e0 + lVar97);
    pIVar93 = pvVar55->DstFont;
    fVar108 = pvVar55->SizePixels;
    local_3c0 = uVar78;
    fVar109 = stbtt_ScaleForPixelHeight(psVar98,fVar108);
    lVar103 = *(long *)((long)pvVar61 + lVar97 + 8);
    lVar97 = (long)*(int *)((long)pvVar61 + lVar97 + 0x24);
    uVar67 = *(ushort *)(lVar103 + 4 + lVar97);
    in_XMM2._0_4_ = (float)(int)(short)(uVar67 << 8 | uVar67 >> 8) * fVar109;
    in_XMM2._4_12_ = auVar127;
    bVar107 = pvVar55->MergeMode;
    local_3a8._0_8_ = pIVar93;
    if ((bool)bVar107 == false) {
      uVar67 = *(ushort *)(lVar103 + 6 + lVar97);
      pIVar93->ContainerAtlas = this;
      pIVar93->ConfigData = pvVar55;
      pIVar93->ConfigDataCount = 0;
      pIVar93->FontSize = fVar108;
      pIVar93->Ascent = in_XMM2._0_4_;
      pIVar93->Descent = fVar109 * (float)(int)(short)(uVar67 << 8 | uVar67 >> 8);
      ImVector<ImFont::Glyph>::resize(&pIVar93->Glyphs,0);
      bVar107 = pvVar55->MergeMode;
      in_XMM2 = ZEXT416((uint)in_XMM2._0_4_);
      pIVar93 = (ImFont *)local_3a8._0_8_;
    }
    pIVar93->ConfigDataCount = pIVar93->ConfigDataCount + 1;
    fVar108 = 0.0;
    if (((bVar107 & 1) != 0) && (pvVar55->MergeGlyphCenterV == true)) {
      in_XMM2._0_4_ = (in_XMM2._0_4_ - pIVar93->Ascent) * 0.5;
      fVar108 = in_XMM2._0_4_;
    }
    pIVar93->FallbackGlyph = (Glyph *)0x0;
    this_00 = &pIVar93->Glyphs;
    local_3e8 = pvVar55;
    for (lVar103 = 0; lVar103 < psVar98[1].fontstart; lVar103 = lVar103 + 1) {
      puVar58 = psVar98[1].data + lVar103 * 0x28;
      lVar84 = 0;
      local_3b8 = puVar58;
      for (lVar97 = 0; lVar97 < *(int *)(puVar58 + 0x10); lVar97 = lVar97 + 1) {
        lVar79 = *(long *)(puVar58 + 0x18);
        uVar67 = *(ushort *)(lVar79 + lVar84);
        if ((((uVar67 != 0) || (*(short *)(lVar79 + 4 + lVar84) != 0)) ||
            (*(short *)(lVar79 + 2 + lVar84) != 0)) || (*(short *)(lVar79 + 6 + lVar84) != 0)) {
          uVar12 = *(undefined4 *)(puVar58 + 4);
          lVar73 = lVar79;
          if (pvVar55->MergeMode == true) {
            pGVar65 = ImFont::FindGlyph((ImFont *)local_3a8._0_8_,(short)lVar97 + (short)uVar12);
            pvVar55 = local_3e8;
            if (pGVar65 != (Glyph *)0x0) goto LAB_00135401;
            lVar73 = *(long *)(puVar58 + 0x18);
            uVar67 = *(ushort *)(lVar73 + lVar84);
          }
          uVar2 = this->TexWidth;
          uVar7 = this->TexHeight;
          fVar109 = *(float *)(lVar73 + 8 + lVar84);
          fVar117 = *(float *)(lVar73 + 0xc + lVar84);
          _local_408 = ZEXT416(*(uint *)(lVar73 + 0x14 + lVar84));
          fVar77 = *(float *)(lVar73 + 0x18 + lVar84);
          uVar10 = *(undefined2 *)(lVar73 + 2 + lVar84);
          uVar80 = *(uint *)(lVar73 + 4 + lVar84);
          ImVector<ImFont::Glyph>::resize(this_00,this_00->Size + 1);
          local_468 = CONCAT44((float)(int)uVar7,(float)(int)uVar2);
          uVar116 = (ushort)(uVar80 >> 0x10);
          auVar38._4_8_ = 0;
          auVar38._0_4_ = uVar80;
          auVar37._12_2_ = uVar116;
          auVar37._0_12_ = auVar38 << 0x20;
          Var33 = CONCAT46(auVar37._10_4_,CONCAT24((short)uVar80,uVar80));
          auVar34._2_10_ = SUB1610(ZEXT616((uint6)((unkuint10)Var33 >> 0x20)) << 0x40,6);
          auVar34._0_2_ = uVar10;
          uVar40 = local_408._0_4_;
          pvVar66 = ImVector<ImFont::Glyph>::back(this_00);
          pvVar66->Codepoint = (short)uVar12 + (short)lVar97;
          auVar112._8_8_ = 0x3f8000003f800000;
          auVar112._0_8_ = 0x3f8000003f800000;
          auVar121._8_8_ = local_468;
          auVar121._0_8_ = local_468;
          auVar111 = divps(auVar112,auVar121);
          pvVar66->U0 = auVar111._0_4_ * (float)uVar67;
          pvVar66->V0 = auVar111._4_4_ * (float)auVar34._0_4_;
          pvVar66->U1 = auVar111._8_4_ * (float)(int)((unkuint10)Var33 >> 0x20);
          pvVar66->V1 = auVar111._12_4_ * (float)uVar116;
          fVar110 = (float)(int)(*(float *)(local_3a8._0_8_ + 0x60) + fVar108 + 0.5);
          pvVar66->Y1 = fVar77 + 0.0 + fVar110;
          in_XMM2 = ZEXT416((uint)fVar110);
          fVar77 = (local_3e8->GlyphExtraSpacing).x + *(float *)(lVar79 + 0x10 + lVar84);
          pvVar66->XAdvance = fVar77;
          pvVar66->X0 = fVar109 + 0.0;
          pvVar66->Y0 = fVar110 + fVar117 + 0.0;
          pvVar66->X1 = (float)uVar40 + 0.0;
          puVar58 = local_3b8;
          pvVar55 = local_3e8;
          if (local_3e8->PixelSnapH == true) {
            pvVar66->XAdvance = (float)(int)(fVar77 + 0.5);
          }
        }
LAB_00135401:
        lVar84 = lVar84 + 0x1c;
      }
    }
    ImFont::BuildLookupTable(pvVar55->DstFont);
    uVar78 = local_3c0 + 1;
  }
  ImGui::MemFree(local_398);
  ImGui::MemFree(local_348);
  ImGui::MemFree(local_3e0);
  RenderCustomTexData(this,1,&extra_rects);
  ImVector<stbrp_rect>::~ImVector(&extra_rects);
LAB_0013547f:
  return iVar11 <= lVar102;
LAB_00133ec0:
  if (local_4a0 != (stbtt__point *)0x0) {
    iVar49 = 0;
    for (uVar74 = 0; uVar104 != uVar74; uVar74 = uVar74 + 1) {
      iVar49 = iVar49 + *(int *)((long)pvVar61 + uVar74 * 4);
    }
    p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar49 + 1) * 0x14);
    fVar109 = local_410;
    local_390 = p_00;
    if (p_00 != (stbtt__edge *)0x0) {
      iVar49 = 0;
      iVar81 = 0;
      for (uVar74 = 0; uVar74 != uVar104; uVar74 = uVar74 + 1) {
        iVar50 = *(int *)((long)pvVar61 + uVar74 * 4);
        uVar72 = (ulong)(iVar50 - 1);
        iVar51 = iVar50;
        for (uVar60 = 0; iVar95 = (int)uVar72, (long)uVar60 < (long)iVar51; uVar60 = uVar60 + 1) {
          fVar117 = local_4a0[(long)iVar49 + (long)iVar95].y;
          fVar77 = local_4a0[(long)iVar49 + uVar60].y;
          if ((fVar117 != fVar77) || (NAN(fVar117) || NAN(fVar77))) {
            iVar96 = (int)uVar60;
            iVar51 = iVar95;
            if (fVar117 <= fVar77) {
              iVar51 = iVar96;
              iVar96 = iVar95;
            }
            p_00[iVar81].invert = (uint)(fVar77 < fVar117);
            sVar4 = local_4a0[(long)iVar49 + (long)iVar51];
            sVar5 = local_4a0[(long)iVar49 + (long)iVar96];
            psVar62 = p_00 + iVar81;
            psVar62->x0 = sVar4.x * fVar110 + 0.0;
            psVar62->y0 = sVar4.y * -fVar118 + 0.0;
            psVar62->x1 = sVar5.x * fVar110 + 0.0;
            psVar62->y1 = sVar5.y * -fVar118 + 0.0;
            iVar81 = iVar81 + 1;
            iVar51 = *(int *)((long)pvVar61 + uVar74 * 4);
          }
          uVar72 = uVar60 & 0xffffffff;
        }
        iVar49 = iVar50 + iVar49;
      }
      stbtt__sort_edges_quicksort(p_00,iVar81);
      psVar62 = p_00;
      for (uVar74 = 1; (long)uVar74 < (long)iVar81; uVar74 = uVar74 + 1) {
        uVar1 = p_00[uVar74].x0;
        uVar6 = p_00[uVar74].y0;
        local_230 = p_00[uVar74].invert;
        x0 = (int)p_00[uVar74].x1;
        uStack_234 = p_00[uVar74].y1;
        psVar85 = psVar62;
        for (uVar60 = uVar74; 0 < (long)uVar60; uVar60 = uVar60 - 1) {
          if (psVar85->y0 <= (float)uVar6) goto LAB_00134098;
          psVar85[1].invert = psVar85->invert;
          fVar117 = psVar85->y0;
          fVar77 = psVar85->x1;
          fVar110 = psVar85->y1;
          psVar85[1].x0 = psVar85->x0;
          psVar85[1].y0 = fVar117;
          psVar85[1].x1 = fVar77;
          psVar85[1].y1 = fVar110;
          psVar85 = psVar85 + -1;
        }
        uVar60 = 0;
LAB_00134098:
        iVar49 = (int)uVar60;
        if (uVar74 != (uVar60 & 0xffffffff)) {
          p_00[iVar49].x0 = (float)uVar1;
          p_00[iVar49].y0 = (float)uVar6;
          p_00[iVar49].x1 = (float)x0;
          p_00[iVar49].y1 = (float)uStack_234;
          p_00[iVar49].invert = local_230;
        }
        psVar62 = psVar62 + 1;
      }
      _y0 = (stbtt__active_edge *)0x0;
      pfVar75 = (float *)&x0;
      if (0x40 < (int)fVar109) {
        pfVar75 = (float *)ImGui::MemAlloc((ulong)(uint)fVar109 * 8 + 4);
        p_00 = local_390;
        fVar109 = local_410;
      }
      iVar49 = (int)local_338;
      lVar86 = (long)(int)fVar109;
      scanline = pfVar75 + lVar86;
      p_00[iVar81].y0 = (float)((int)local_330 + iVar49) + 1.0;
      local_3c0 = CONCAT44(local_3c0._4_4_,(float)iVar83);
      iVar83 = local_408._0_4_;
      local_3c8 = CONCAT44(local_3c8._4_4_,(float)(int)fVar109);
      fVar117 = 0.0;
      if (0 < (int)fVar109) {
        fVar117 = fVar109;
      }
      local_3e8 = (value_type *)CONCAT44(local_3e8._4_4_,fVar117);
      lVar87 = 0;
      if (0 < lVar86) {
        lVar87 = lVar86;
      }
      local_328 = 0;
      local_338 = local_338 & 0xffffffff;
      if (iVar49 < 1) {
        local_338 = 0;
      }
      psVar100 = (stbtt__active_edge *)0x0;
      local_46c = 0;
      local_3f0 = (undefined8 *)0x0;
      iVar49 = 0;
      uVar74 = local_330;
      while (lVar99 = local_3d0, puVar63 = local_3f0, iVar49 != (int)local_338) {
        fVar109 = (float)(int)uVar74;
        fVar117 = fVar109 + 1.0;
        local_330 = uVar74;
        local_318 = iVar49;
        memset(pfVar75,0,lVar86 * 4);
        memset(scanline,0,(long)(iVar83 + 2) << 2);
        psVar70 = (stbtt__active_edge *)&y0;
        while (psVar69 = psVar70, psVar14 = psVar69->next, psVar14 != (stbtt__active_edge *)0x0) {
          psVar70 = psVar14;
          if (psVar14->ey <= fVar109) {
            psVar69->next = psVar14->next;
            if ((psVar14->direction == 0.0) && (!NAN(psVar14->direction))) {
              __assert_fail("z->direction",
                            "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                            ,0x83b,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar14->direction = 0.0;
            psVar14->next = psVar100;
            psVar70 = psVar69;
            psVar100 = psVar14;
          }
        }
        for (; fVar77 = p_00->y0, fVar77 <= fVar117; p_00 = p_00 + 1) {
          fVar110 = p_00->y1;
          if ((fVar77 != fVar110) || (NAN(fVar77) || NAN(fVar110))) {
            if (psVar100 == (stbtt__active_edge *)0x0) {
              if (local_46c == 0) {
                puVar63 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar63 == (undefined8 *)0x0) goto LAB_001354e2;
                *puVar63 = local_3f0;
                psVar100 = (stbtt__active_edge *)(puVar63 + 0xc7c);
                fVar77 = p_00->y0;
                fVar110 = p_00->y1;
                local_46c = 799;
                psVar70 = (stbtt__active_edge *)0x0;
                local_3f0 = puVar63;
              }
              else {
                if (local_3f0 == (undefined8 *)0x0) {
LAB_001354e2:
                  __assert_fail("z != __null",
                                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                ,0x6ab,
                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                               );
                }
                lVar99 = (long)local_46c;
                local_46c = local_46c + -1;
                psVar100 = (stbtt__active_edge *)(local_3f0 + lVar99 * 4 + -4);
                psVar70 = (stbtt__active_edge *)0x0;
              }
            }
            else {
              psVar70 = psVar100->next;
            }
            fVar118 = p_00->x0;
            fVar120 = (p_00->x1 - fVar118) / (fVar110 - fVar77);
            psVar100->fdx = fVar120;
            psVar100->fdy = (float)(-(uint)(fVar120 != 0.0) & (uint)(1.0 / fVar120));
            psVar100->fx = ((fVar109 - fVar77) * fVar120 + fVar118) - (float)local_3c0;
            psVar100->direction = *(float *)(&DAT_00157dcc + (ulong)(p_00->invert == 0) * 4);
            psVar100->sy = fVar77;
            psVar100->ey = fVar110;
            psVar100->next = (stbtt__active_edge *)0x0;
            if (fVar110 < fVar109) {
              __assert_fail("z->ey >= scan_y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                            ,0x848,
                            "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                           );
            }
            psVar100->next = _y0;
            _y0 = psVar100;
            psVar100 = psVar70;
          }
        }
        psVar70 = _y0;
        if (_y0 != (stbtt__active_edge *)0x0) {
          for (; psVar70 != (stbtt__active_edge *)0x0; psVar70 = psVar70->next) {
            fVar77 = psVar70->ey;
            if (fVar77 < fVar109) {
              __assert_fail("e->ey >= y_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                            ,0x77f,
                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                           );
            }
            fVar110 = psVar70->fx;
            fVar118 = psVar70->fdx;
            if ((fVar118 != 0.0) || (NAN(fVar118))) {
              fVar120 = psVar70->sy;
              if (fVar117 < fVar120) {
                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                              "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                              ,0x792,
                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                             );
              }
              fVar133 = fVar118 + fVar110;
              fVar132 = (float)(~-(uint)(fVar109 < fVar120) & (uint)fVar110 |
                               (uint)((fVar120 - fVar109) * fVar118 + fVar110) &
                               -(uint)(fVar109 < fVar120));
              if ((((fVar132 < 0.0) ||
                   (fVar131 = (float)(~-(uint)(fVar77 < fVar117) & (uint)fVar133 |
                                     (uint)((fVar77 - fVar109) * fVar118 + fVar110) &
                                     -(uint)(fVar77 < fVar117)), fVar131 < 0.0)) ||
                  ((float)local_3c8 <= fVar132)) || ((float)local_3c8 <= fVar131)) {
                local_3a8 = ZEXT416((uint)fVar110);
                _local_408 = ZEXT416((uint)fVar133);
                local_3b8 = (uchar *)CONCAT44(local_3b8._4_4_,fVar118);
                fVar77 = 0.0;
                fVar120 = 0.0;
                iVar49 = 0;
                while (local_3e8._0_4_ != (float)iVar49) {
                  fVar132 = (float)iVar49;
                  fVar129 = (float)(iVar49 + 1);
                  fVar131 = (fVar132 - fVar110) / fVar118 + fVar109;
                  fVar118 = (fVar129 - fVar110) / fVar118 + fVar109;
                  if ((fVar132 <= fVar110) || (fVar133 <= fVar129)) {
                    if ((fVar132 <= fVar133) || (fVar110 <= fVar129)) {
                      fVar119 = fVar109;
                      if (((fVar132 <= fVar110) || (fVar133 <= fVar132)) &&
                         ((fVar132 <= fVar133 || (fVar110 <= fVar132)))) {
                        if (((fVar110 < fVar129) && (fVar131 = fVar109, fVar129 < fVar133)) ||
                           ((fVar133 < fVar129 && (fVar131 = fVar109, fVar129 < fVar110))))
                        goto LAB_0013465c;
                        auVar125._4_4_ = 0;
                        auVar125._0_4_ = fVar133;
                        auVar125._8_4_ = fVar77;
                        auVar125._12_4_ = fVar120;
                        fVar132 = fVar110;
                        fVar131 = fVar109;
                        goto LAB_00134717;
                      }
                    }
                    else {
                      stbtt__handle_clipped_edge
                                (pfVar75,iVar49,psVar70,fVar110,fVar109,fVar129,fVar118);
                      fVar110 = fVar129;
                      fVar119 = fVar118;
                    }
                    stbtt__handle_clipped_edge
                              (pfVar75,iVar49,psVar70,fVar110,fVar119,fVar132,fVar131);
                    auVar125 = _local_408;
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (pfVar75,iVar49,psVar70,fVar110,fVar109,fVar132,fVar131);
                    fVar110 = fVar132;
LAB_0013465c:
                    stbtt__handle_clipped_edge
                              (pfVar75,iVar49,psVar70,fVar110,fVar131,fVar129,fVar118);
                    auVar125 = _local_408;
                    fVar132 = fVar129;
                    fVar131 = fVar118;
                  }
LAB_00134717:
                  stbtt__handle_clipped_edge
                            (pfVar75,iVar49,psVar70,fVar132,fVar131,auVar125._0_4_,fVar117);
                  fVar110 = (float)local_3a8._0_4_;
                  fVar133 = (float)local_408._0_4_;
                  fVar77 = (float)local_408._8_4_;
                  fVar120 = fStack_3fc;
                  iVar49 = iVar49 + 1;
                  fVar118 = local_3b8._0_4_;
                }
              }
              else {
                if (fVar120 <= fVar109) {
                  fVar120 = fVar109;
                }
                uVar52 = (uint)fVar132;
                if (fVar117 <= fVar77) {
                  fVar77 = fVar117;
                }
                uVar53 = (uint)fVar131;
                if (uVar52 == uVar53) {
                  if (((int)uVar52 < 0) || ((int)local_410 <= (int)uVar52)) {
                    __assert_fail("x >= 0 && x < len",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                  ,0x7ae,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  uVar74 = (ulong)uVar52;
                  pfVar75[uVar74] =
                       (((fVar131 - (float)(int)uVar52) + (fVar132 - (float)(int)uVar52)) * -0.5 +
                       1.0) * psVar70->direction * (fVar77 - fVar120) + pfVar75[uVar74];
                  fVar110 = (fVar77 - fVar120) * psVar70->direction;
                }
                else {
                  fVar118 = psVar70->fdy;
                  uVar54 = uVar52;
                  fVar129 = fVar132;
                  if (fVar131 < fVar132) {
                    fVar129 = fVar109 - fVar120;
                    fVar120 = (fVar109 - fVar77) + fVar117;
                    fVar118 = -fVar118;
                    fVar110 = fVar133;
                    uVar54 = uVar53;
                    uVar53 = uVar52;
                    fVar77 = fVar129 + fVar117;
                    fVar129 = fVar131;
                    fVar131 = fVar132;
                  }
                  iVar49 = uVar54 + 1;
                  fVar132 = ((float)iVar49 - fVar110) * fVar118 + fVar109;
                  fVar110 = psVar70->direction;
                  fVar133 = (fVar132 - fVar120) * fVar110;
                  pfVar75[(int)uVar54] =
                       (1.0 - ((fVar129 - (float)(int)uVar54) + 1.0) * 0.5) * fVar133 +
                       pfVar75[(int)uVar54];
                  uVar74 = (ulong)(int)uVar53;
                  for (lVar99 = (long)iVar49; lVar99 < (long)uVar74; lVar99 = lVar99 + 1) {
                    pfVar75[lVar99] = fVar118 * fVar110 * 0.5 + fVar133 + pfVar75[lVar99];
                    fVar133 = fVar133 + fVar118 * fVar110;
                  }
                  if (1.01 < ABS(fVar133)) {
                    __assert_fail("fabs(area) <= 1.01f",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                  ,0x7d3,
                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                 );
                  }
                  pfVar75[uVar74] =
                       (fVar77 - (fVar118 * (float)(int)(uVar53 - iVar49) + fVar132)) *
                       (((fVar131 - (float)(int)uVar53) + 0.0) * -0.5 + 1.0) * fVar110 + fVar133 +
                       pfVar75[uVar74];
                  fVar110 = (fVar77 - fVar120) * fVar110;
                }
                scanline[uVar74 + 1] = fVar110 + scanline[uVar74 + 1];
              }
            }
            else if (fVar110 < (float)local_3c8) {
              if (0.0 <= fVar110) {
                local_3a8 = ZEXT416((uint)fVar110);
                stbtt__handle_clipped_edge
                          (pfVar75,(int)fVar110,psVar70,fVar110,fVar109,fVar110,fVar117);
                iVar49 = (int)fVar110 + 1;
                auVar111 = local_3a8;
              }
              else {
                iVar49 = 0;
                auVar111 = ZEXT416((uint)fVar110);
              }
              stbtt__handle_clipped_edge
                        (scanline,iVar49,psVar70,auVar111._0_4_,fVar109,auVar111._0_4_,fVar117);
            }
          }
        }
        fVar109 = 0.0;
        lVar99 = lVar87;
        pfVar71 = pfVar75;
        uVar74 = local_328;
        while (bVar106 = lVar99 != 0, lVar99 = lVar99 + -1, bVar106) {
          fVar109 = fVar109 + pfVar71[lVar86];
          iVar49 = (int)(ABS(*pfVar71 + fVar109) * 255.0 + 0.5);
          if (0xfe < iVar49) {
            iVar49 = 0xff;
          }
          puVar58[(long)(int)uVar74 + (long)iVar94 + (ulong)uVar126] = (uchar)iVar49;
          uVar74 = (ulong)((int)uVar74 + 1);
          pfVar71 = pfVar71 + 1;
        }
        plVar64 = (long *)&y0;
        while (plVar64 = (long *)*plVar64, plVar64 != (long *)0x0) {
          *(float *)(plVar64 + 1) = *(float *)((long)plVar64 + 0xc) + *(float *)(plVar64 + 1);
        }
        uVar74 = (ulong)((int)local_330 + 1);
        local_328 = (ulong)((int)local_328 + local_3ac);
        iVar49 = local_318 + 1;
      }
      while (puVar63 != (undefined8 *)0x0) {
        puVar15 = (undefined8 *)*puVar63;
        ImGui::MemFree(puVar63);
        puVar63 = puVar15;
      }
      if (pfVar75 != (float *)&x0) {
        ImGui::MemFree(pfVar75);
      }
      ImGui::MemFree(local_390);
    }
    ImGui::MemFree(pvVar61);
    ImGui::MemFree(local_4a0);
  }
LAB_00134a95:
  ImGui::MemFree((void *)CONCAT44(uStack_384,x1));
  uVar54 = local_380.h_oversample;
  uVar60 = local_380._32_8_ & 0xffffffff;
  uVar53 = *(uint *)(lVar99 + 8);
  uVar52 = *(uint *)(lVar99 + 4);
  if (1 < uVar60) {
    lVar87 = (long)local_380.stride_in_bytes;
    lVar86 = (long)(int)((uVar53 >> 0x10) * local_380.stride_in_bytes);
    puVar58 = local_380.pixels + lVar86 + (ulong)(ushort)uVar53;
    iVar83 = (uVar52 & 0xffff) - local_380.h_oversample;
    _x0 = 0;
    if (iVar83 < 0) {
      iVar83 = -1;
    }
    uVar74 = (long)iVar83 + 1;
    puVar82 = local_380.pixels + lVar86 + (ulong)(ushort)uVar53 + (long)iVar83 + 1;
    for (uVar53 = 0; uVar53 != uVar52 >> 0x10; uVar53 = uVar53 + 1) {
      memset(&x0,0,uVar60);
      puVar89 = puVar82;
      uVar104 = uVar74;
      switch(uVar54) {
      case 2:
        uVar72 = 0;
        for (uVar88 = 0; uVar74 != uVar88; uVar88 = uVar88 + 1) {
          bVar107 = puVar58[uVar88];
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 2 & 7)) = bVar107;
          uVar68 = (int)uVar72 + ((uint)bVar107 - (uint)bVar9);
          uVar72 = (ulong)uVar68;
          puVar58[uVar88] = (uchar)(uVar68 >> 1);
        }
        break;
      case 3:
        uVar72 = 0;
        for (uVar88 = 0; uVar74 != uVar88; uVar88 = uVar88 + 1) {
          bVar107 = puVar58[uVar88];
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 3 & 7)) = bVar107;
          uVar72 = (ulong)((int)uVar72 + ((uint)bVar107 - (uint)bVar9));
          puVar58[uVar88] = (uchar)(uVar72 / 3);
        }
        break;
      case 4:
        uVar72 = 0;
        for (uVar88 = 0; uVar74 != uVar88; uVar88 = uVar88 + 1) {
          bVar107 = puVar58[uVar88];
          uVar90 = (ulong)((uint)uVar88 & 7);
          *(byte *)((long)&x0 + (uVar90 ^ 4)) = bVar107;
          uVar68 = (int)uVar72 + ((uint)bVar107 - (uint)*(byte *)((long)&x0 + uVar90));
          uVar72 = (ulong)uVar68;
          puVar58[uVar88] = (uchar)(uVar68 >> 2);
        }
        break;
      case 5:
        uVar72 = 0;
        for (uVar88 = 0; uVar74 != uVar88; uVar88 = uVar88 + 1) {
          bVar107 = puVar58[uVar88];
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar88 + 5 & 7)) = bVar107;
          uVar72 = (ulong)((int)uVar72 + ((uint)bVar107 - (uint)bVar9));
          puVar58[uVar88] = (uchar)(uVar72 / 5);
        }
        break;
      default:
        uVar72 = 0;
        for (uVar88 = 0; uVar74 != uVar88; uVar88 = uVar88 + 1) {
          bVar107 = puVar58[uVar88];
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar88 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar54 + (uint)uVar88 & 7)) = bVar107;
          uVar68 = (int)uVar72 + ((uint)bVar107 - (uint)bVar9);
          uVar72 = (ulong)uVar68;
          puVar58[uVar88] = (uchar)(uVar68 / uVar54);
        }
      }
      for (; uVar104 < (uVar52 & 0xffff); uVar104 = uVar104 + 1) {
        if (*puVar89 != '\0') {
          __assert_fail("pixels[i] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                        ,0xada,
                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar68 = (int)uVar72 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar104 & 7));
        uVar72 = (ulong)uVar68;
        *puVar89 = (uchar)(uVar68 / uVar54);
        puVar89 = puVar89 + 1;
      }
      puVar58 = puVar58 + lVar87;
      puVar82 = puVar82 + lVar87;
    }
    uVar53 = *(uint *)(local_3d0 + 8);
    uVar52 = *(uint *)(local_3d0 + 4);
  }
  uVar54 = local_380.v_oversample;
  uVar74 = (ulong)local_380.v_oversample;
  if (1 < uVar74) {
    lVar87 = (long)local_380.stride_in_bytes;
    lVar86 = (long)(int)((uVar53 >> 0x10) * local_380.stride_in_bytes);
    pbVar101 = local_380.pixels + lVar86 + (ulong)(ushort)uVar53;
    uVar67 = (ushort)(uVar52 >> 0x10);
    _x0 = 0;
    iVar83 = uVar67 - local_380.v_oversample;
    if (iVar83 < 0) {
      iVar83 = -1;
    }
    uVar104 = (long)iVar83 + 1;
    puVar58 = local_380.pixels + uVar104 * lVar87 + lVar86 + (ulong)(ushort)uVar53;
    for (uVar53 = 0; uVar53 != (uVar52 & 0xffff); uVar53 = uVar53 + 1) {
      memset(&x0,0,uVar74);
      puVar82 = puVar58;
      uVar72 = uVar104;
      switch(uVar54) {
      case 2:
        uVar88 = 0;
        pbVar92 = pbVar101;
        for (uVar90 = 0; uVar104 != uVar90; uVar90 = uVar90 + 1) {
          bVar107 = *pbVar92;
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar90 + 2 & 7)) = bVar107;
          uVar68 = (int)uVar88 + ((uint)bVar107 - (uint)bVar9);
          uVar88 = (ulong)uVar68;
          *pbVar92 = (byte)(uVar68 >> 1);
          pbVar92 = pbVar92 + lVar87;
        }
        break;
      case 3:
        uVar88 = 0;
        pbVar92 = pbVar101;
        for (uVar90 = 0; uVar104 != uVar90; uVar90 = uVar90 + 1) {
          bVar107 = *pbVar92;
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar90 + 3 & 7)) = bVar107;
          uVar88 = (ulong)((int)uVar88 + ((uint)bVar107 - (uint)bVar9));
          *pbVar92 = (byte)(uVar88 / 3);
          pbVar92 = pbVar92 + lVar87;
        }
        break;
      case 4:
        uVar88 = 0;
        pbVar92 = pbVar101;
        for (uVar90 = 0; uVar104 != uVar90; uVar90 = uVar90 + 1) {
          bVar107 = *pbVar92;
          uVar91 = (ulong)((uint)uVar90 & 7);
          *(byte *)((long)&x0 + (uVar91 ^ 4)) = bVar107;
          uVar68 = (int)uVar88 + ((uint)bVar107 - (uint)*(byte *)((long)&x0 + uVar91));
          uVar88 = (ulong)uVar68;
          *pbVar92 = (byte)(uVar68 >> 2);
          pbVar92 = pbVar92 + lVar87;
        }
        break;
      case 5:
        uVar88 = 0;
        pbVar92 = pbVar101;
        for (uVar90 = 0; uVar104 != uVar90; uVar90 = uVar90 + 1) {
          bVar107 = *pbVar92;
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar90 + 5 & 7)) = bVar107;
          uVar88 = (ulong)((int)uVar88 + ((uint)bVar107 - (uint)bVar9));
          *pbVar92 = (byte)(uVar88 / 5);
          pbVar92 = pbVar92 + lVar87;
        }
        break;
      default:
        uVar88 = 0;
        pbVar92 = pbVar101;
        for (uVar90 = 0; uVar104 != uVar90; uVar90 = uVar90 + 1) {
          bVar107 = *pbVar92;
          bVar9 = *(byte *)((long)&x0 + (ulong)((uint)uVar90 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar54 + (uint)uVar90 & 7)) = bVar107;
          uVar68 = (int)uVar88 + ((uint)bVar107 - (uint)bVar9);
          uVar88 = (ulong)uVar68;
          *pbVar92 = (byte)(uVar68 / uVar54);
          pbVar92 = pbVar92 + lVar87;
        }
      }
      for (; uVar72 < uVar67; uVar72 = uVar72 + 1) {
        if (*puVar82 != '\0') {
          __assert_fail("pixels[i*stride_in_bytes] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                        ,0xb18,
                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)");
        }
        uVar68 = (int)uVar88 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar72 & 7));
        uVar88 = (ulong)uVar68;
        *puVar82 = (uchar)(uVar68 / uVar54);
        puVar82 = puVar82 + lVar87;
      }
      pbVar101 = pbVar101 + 1;
      puVar58 = puVar58 + 1;
    }
    uVar53 = *(uint *)(local_3d0 + 8);
    uVar52 = *(uint *)(local_3d0 + 4);
  }
  *puVar59 = uVar53;
  uVar67 = (ushort)(uVar52 >> 0x10);
  puVar59[1] = CONCAT22((short)(uVar53 >> 0x10) + uVar67,(short)uVar53 + (short)uVar52);
  puVar59[4] = (uint)((float)(int)(short)((short)(local_31c << 8) + (short)local_320) * fVar108);
  in_XMM2._4_4_ = (float)y0_1;
  in_XMM2._0_4_ = (float)x0_1;
  in_XMM2._8_8_ = 0;
  *(ulong *)(puVar59 + 2) =
       CONCAT44((float)y0_1 * local_258._4_4_ + local_248._4_4_,
                (float)x0_1 * local_258._0_4_ + local_248._0_4_);
  puVar59[5] = (uint)((float)(int)((uVar52 & 0xffff) + x0_1) * local_258._0_4_ + local_248._0_4_);
  puVar59[6] = (uint)((float)(int)((uint)uVar67 + y0_1) * local_258._4_4_ + local_248._4_4_);
LAB_00135006:
  lVar79 = lVar79 + 1;
  lVar73 = lVar73 + 1;
  goto LAB_00133a80;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}